

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

int fiorfda(osfildef *fp,vocddef *p,uint cnt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  size_t sVar9;
  long lVar10;
  vocddef *pvVar11;
  ulong uVar12;
  int iVar14;
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar26;
  int iVar31;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar32;
  int iVar34;
  undefined1 auVar33 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar37 [16];
  uchar buf [14];
  ushort local_2e;
  objnum local_2c;
  byte local_2a;
  int local_29;
  prpnum local_25;
  ushort local_23;
  
  auVar8 = _DAT_0013da70;
  auVar7 = _DAT_0013da60;
  auVar6 = _DAT_0013da50;
  auVar5 = _DAT_0013da40;
  auVar4 = _DAT_0013da30;
  if (cnt != 0) {
    lVar10 = (ulong)cnt - 1;
    auVar13._8_4_ = (int)lVar10;
    auVar13._0_8_ = lVar10;
    auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
    pvVar11 = p + 7;
    uVar12 = 0;
    auVar13 = auVar13 ^ _DAT_0013da70;
    do {
      auVar25._8_4_ = (int)uVar12;
      auVar25._0_8_ = uVar12;
      auVar25._12_4_ = (int)(uVar12 >> 0x20);
      auVar17 = (auVar25 | auVar7) ^ auVar8;
      iVar26 = auVar13._0_4_;
      iVar32 = -(uint)(iVar26 < auVar17._0_4_);
      iVar14 = auVar13._4_4_;
      auVar18._4_4_ = -(uint)(iVar14 < auVar17._4_4_);
      iVar31 = auVar13._8_4_;
      iVar34 = -(uint)(iVar31 < auVar17._8_4_);
      iVar15 = auVar13._12_4_;
      auVar18._12_4_ = -(uint)(iVar15 < auVar17._12_4_);
      auVar28._4_4_ = iVar32;
      auVar28._0_4_ = iVar32;
      auVar28._8_4_ = iVar34;
      auVar28._12_4_ = iVar34;
      auVar35 = pshuflw(in_XMM11,auVar28,0xe8);
      auVar20._4_4_ = -(uint)(auVar17._4_4_ == iVar14);
      auVar20._12_4_ = -(uint)(auVar17._12_4_ == iVar15);
      auVar20._0_4_ = auVar20._4_4_;
      auVar20._8_4_ = auVar20._12_4_;
      auVar37 = pshuflw(in_XMM12,auVar20,0xe8);
      auVar18._0_4_ = auVar18._4_4_;
      auVar18._8_4_ = auVar18._12_4_;
      auVar36 = pshuflw(auVar35,auVar18,0xe8);
      auVar17._8_4_ = 0xffffffff;
      auVar17._0_8_ = 0xffffffffffffffff;
      auVar17._12_4_ = 0xffffffff;
      auVar17 = (auVar36 | auVar37 & auVar35) ^ auVar17;
      auVar17 = packssdw(auVar17,auVar17);
      if ((auVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pvVar11[-7].vocdfn = 0xffff;
      }
      auVar18 = auVar20 & auVar28 | auVar18;
      auVar17 = packssdw(auVar18,auVar18);
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar17 = packssdw(auVar17 ^ auVar36,auVar17 ^ auVar36);
      if ((auVar17._0_4_ >> 0x10 & 1) != 0) {
        pvVar11[-6].vocdfn = 0xffff;
      }
      auVar17 = (auVar25 | auVar6) ^ auVar8;
      iVar32 = -(uint)(iVar26 < auVar17._0_4_);
      auVar33._4_4_ = -(uint)(iVar14 < auVar17._4_4_);
      iVar34 = -(uint)(iVar31 < auVar17._8_4_);
      auVar33._12_4_ = -(uint)(iVar15 < auVar17._12_4_);
      auVar19._4_4_ = iVar32;
      auVar19._0_4_ = iVar32;
      auVar19._8_4_ = iVar34;
      auVar19._12_4_ = iVar34;
      auVar27._4_4_ = -(uint)(auVar17._4_4_ == iVar14);
      auVar27._12_4_ = -(uint)(auVar17._12_4_ == iVar15);
      auVar27._0_4_ = auVar27._4_4_;
      auVar27._8_4_ = auVar27._12_4_;
      auVar33._0_4_ = auVar33._4_4_;
      auVar33._8_4_ = auVar33._12_4_;
      auVar17 = auVar27 & auVar19 | auVar33;
      auVar17 = packssdw(auVar17,auVar17);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar17 = packssdw(auVar17 ^ auVar1,auVar17 ^ auVar1);
      if ((auVar17 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pvVar11[-5].vocdfn = 0xffff;
      }
      auVar20 = pshufhw(auVar19,auVar19,0x84);
      auVar28 = pshufhw(auVar27,auVar27,0x84);
      auVar18 = pshufhw(auVar20,auVar33,0x84);
      auVar21._8_4_ = 0xffffffff;
      auVar21._0_8_ = 0xffffffffffffffff;
      auVar21._12_4_ = 0xffffffff;
      auVar21 = (auVar18 | auVar28 & auVar20) ^ auVar21;
      auVar20 = packssdw(auVar21,auVar21);
      if ((auVar20 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pvVar11[-4].vocdfn = 0xffff;
      }
      auVar20 = (auVar25 | auVar5) ^ auVar8;
      iVar32 = -(uint)(iVar26 < auVar20._0_4_);
      auVar23._4_4_ = -(uint)(iVar14 < auVar20._4_4_);
      iVar34 = -(uint)(iVar31 < auVar20._8_4_);
      auVar23._12_4_ = -(uint)(iVar15 < auVar20._12_4_);
      auVar29._4_4_ = iVar32;
      auVar29._0_4_ = iVar32;
      auVar29._8_4_ = iVar34;
      auVar29._12_4_ = iVar34;
      auVar17 = pshuflw(auVar17,auVar29,0xe8);
      auVar22._4_4_ = -(uint)(auVar20._4_4_ == iVar14);
      auVar22._12_4_ = -(uint)(auVar20._12_4_ == iVar15);
      auVar22._0_4_ = auVar22._4_4_;
      auVar22._8_4_ = auVar22._12_4_;
      auVar20 = pshuflw(auVar37 & auVar35,auVar22,0xe8);
      in_XMM12 = auVar20 & auVar17;
      auVar23._0_4_ = auVar23._4_4_;
      auVar23._8_4_ = auVar23._12_4_;
      auVar17 = pshuflw(auVar17,auVar23,0xe8);
      auVar35._8_4_ = 0xffffffff;
      auVar35._0_8_ = 0xffffffffffffffff;
      auVar35._12_4_ = 0xffffffff;
      auVar35 = (auVar17 | in_XMM12) ^ auVar35;
      in_XMM11 = packssdw(auVar35,auVar35);
      if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pvVar11[-3].vocdfn = 0xffff;
      }
      auVar23 = auVar22 & auVar29 | auVar23;
      auVar17 = packssdw(auVar23,auVar23);
      auVar37._8_4_ = 0xffffffff;
      auVar37._0_8_ = 0xffffffffffffffff;
      auVar37._12_4_ = 0xffffffff;
      auVar17 = packssdw(auVar17 ^ auVar37,auVar17 ^ auVar37);
      if ((auVar17 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pvVar11[-2].vocdfn = 0xffff;
      }
      auVar17 = (auVar25 | auVar4) ^ auVar8;
      iVar26 = -(uint)(iVar26 < auVar17._0_4_);
      auVar30._4_4_ = -(uint)(iVar14 < auVar17._4_4_);
      iVar31 = -(uint)(iVar31 < auVar17._8_4_);
      auVar30._12_4_ = -(uint)(iVar15 < auVar17._12_4_);
      auVar24._4_4_ = iVar26;
      auVar24._0_4_ = iVar26;
      auVar24._8_4_ = iVar31;
      auVar24._12_4_ = iVar31;
      auVar16._4_4_ = -(uint)(auVar17._4_4_ == iVar14);
      auVar16._12_4_ = -(uint)(auVar17._12_4_ == iVar15);
      auVar16._0_4_ = auVar16._4_4_;
      auVar16._8_4_ = auVar16._12_4_;
      auVar30._0_4_ = auVar30._4_4_;
      auVar30._8_4_ = auVar30._12_4_;
      auVar17 = auVar16 & auVar24 | auVar30;
      auVar17 = packssdw(auVar17,auVar17);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar17 = packssdw(auVar17 ^ auVar2,auVar17 ^ auVar2);
      if ((auVar17 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pvVar11[-1].vocdfn = 0xffff;
      }
      auVar25 = pshufhw(auVar24,auVar24,0x84);
      auVar17 = pshufhw(auVar16,auVar16,0x84);
      auVar20 = pshufhw(auVar25,auVar30,0x84);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar17 = packssdw(auVar17 & auVar25,(auVar20 | auVar17 & auVar25) ^ auVar3);
      if ((auVar17 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pvVar11->vocdfn = 0xffff;
      }
      uVar12 = uVar12 + 8;
      pvVar11 = pvVar11 + 8;
    } while (((ulong)cnt + 7 & 0xfffffffffffffff8) != uVar12);
  }
  sVar9 = fread(&local_2e,0xd,1,(FILE *)fp);
  if (sVar9 == 1) {
    do {
      if (local_2e == 0xffff) {
        return 0;
      }
      uVar12 = (ulong)local_2e;
      p[uVar12].vocdfn = local_2c;
      p[uVar12].vocdarg.runstyp = local_2a;
      if (local_2a < 10) {
        if (local_2a == 1) {
          p[uVar12].vocdarg.runsv = (anon_union_8_4_1dda36f5_for_runsv)(long)local_29;
        }
        else if (local_2a == 2) goto LAB_0012b16b;
      }
      else if ((local_2a == 10) || (local_2a == 0xd)) {
LAB_0012b16b:
        p[uVar12].vocdarg.runsv.runsvobj = (objnum)local_29;
      }
      p[uVar12].vocdprp = local_25;
      p[uVar12].vocdtim = (uint)local_23;
      sVar9 = fread(&local_2e,0xd,1,(FILE *)fp);
    } while (sVar9 == 1);
  }
  return 1;
}

Assistant:

static int fiorfda(osfildef *fp, vocddef *p, uint cnt)
{
    vocddef *q;
    uint     i;
    uchar    buf[14];
    
    /* start by clearing out entire record */
    for (i = 0, q = p ; i < cnt ; ++q, ++i)
        q->vocdfn = MCMONINV;
    
    /* now restore all the records from the file */
    for (;;)
    {
        /* read a record, and quit if it's the last one */
        if (osfrb(fp, buf, 13)) return(TRUE);
        if ((i = osrp2(buf)) == 0xffff) return(FALSE);
        
        /* restore this record */
        q = p + i;
        q->vocdfn = osrp2(buf+2);
        q->vocdarg.runstyp = buf[4];
        switch(buf[4])
        {
        case DAT_NUMBER:
            q->vocdarg.runsv.runsvnum = osrp4s(buf+5);
            break;
        case DAT_OBJECT:
        case DAT_FNADDR:
            q->vocdarg.runsv.runsvobj = osrp2(buf+5);
            break;
        case DAT_PROPNUM:
            q->vocdarg.runsv.runsvprp = osrp2(buf+5);
            break;
        }
        q->vocdprp = osrp2(buf+9);
        q->vocdtim = osrp2(buf+11);
    }
}